

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::advance_from_known_actions(search_private *priv)

{
  ulong uVar1;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar2;
  ulong uVar3;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar4;
  
  while( true ) {
    if (priv->active_csoaa != true) {
      return;
    }
    if (0.0 < priv->active_csoaa_verify) {
      return;
    }
    uVar1 = priv->learn_t;
    pvVar2 = (priv->active_known)._begin;
    if ((ulong)((long)(priv->active_known)._end - (long)pvVar2 >> 5) <= uVar1) {
      return;
    }
    uVar3 = priv->learn_a_idx;
    ppVar4 = pvVar2[uVar1]._begin;
    if ((ulong)((long)pvVar2[uVar1]._end - (long)ppVar4 >> 4) <= uVar3) break;
    if (ppVar4[uVar3].second != false) {
      return;
    }
    v_array<COST_SENSITIVE::wclass>::push_back
              ((v_array<COST_SENSITIVE::wclass> *)&(priv->learn_losses).simple,ppVar4[uVar3].first);
    priv->learn_a_idx = priv->learn_a_idx + 1;
  }
  priv->done_with_all_actions = true;
  return;
}

Assistant:

void advance_from_known_actions(search_private& priv)
{
  size_t t = priv.learn_t;
  if (!priv.active_csoaa)
    return;
  if (priv.active_csoaa_verify > 0.)
    return;
  if (t >= priv.active_known.size())
    return;
  cdbg << "advance_from_known_actions t=" << t << " active_known.size()=" << priv.active_known.size()
       << " learn_a_idx=" << priv.learn_a_idx << endl;
  // cdbg_print_array(" active_known[t]", priv.active_known[t]);
  if (priv.learn_a_idx >= priv.active_known[t].size())
  {
    cdbg << "advance_from_known_actions setting done_with_all_actions=true (active_known[t].size()="
         << priv.active_known[t].size() << ")" << endl;
    priv.done_with_all_actions = true;
    return;
  }
  // if (priv.active_known[t][priv.learn_a_idx] >= FLT_MAX) return;
  if (priv.active_known[t][priv.learn_a_idx].second)
    return;
  // return;
  // wow, we actually found something we were confident about!
  /*
  cs_cost_push_back(priv.cb_learner,
                    priv.learn_losses,
                    priv.is_ldf ? (uint32_t)(priv.learn_a_idx - 1) : (uint32_t)priv.learn_a_idx,
                    priv.active_known[t][priv.learn_a_idx],
                    true);
  */
  priv.learn_losses.cs.costs.push_back(priv.active_known[t][priv.learn_a_idx].first);
  cdbg << "  --> adding " << priv.learn_a_idx << ":" << priv.active_known[t][priv.learn_a_idx].first.x << endl;
  priv.learn_a_idx++;
  advance_from_known_actions(priv);
}